

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlSAX2ElementDecl(void)

{
  int iVar1;
  int iVar2;
  void *val;
  xmlChar *val_00;
  xmlElementContentPtr val_01;
  int local_44;
  int n_content;
  xmlElementContentPtr content;
  int n_type;
  int type;
  int n_name;
  xmlChar *name;
  int n_ctx;
  void *ctx;
  int mem_base;
  int test_ret;
  
  ctx._4_4_ = 0;
  for (name._4_4_ = 0; (int)name._4_4_ < 2; name._4_4_ = name._4_4_ + 1) {
    for (n_type = 0; n_type < 5; n_type = n_type + 1) {
      for (content._4_4_ = 0; (int)content._4_4_ < 4; content._4_4_ = content._4_4_ + 1) {
        for (local_44 = 0; local_44 < 1; local_44 = local_44 + 1) {
          iVar1 = xmlMemBlocks();
          val = gen_void_ptr(name._4_4_,0);
          val_00 = gen_const_xmlChar_ptr(n_type,1);
          iVar2 = gen_int(content._4_4_,2);
          val_01 = gen_xmlElementContentPtr(local_44,3);
          xmlSAX2ElementDecl(val,val_00,iVar2,val_01);
          call_tests = call_tests + 1;
          des_void_ptr(name._4_4_,val,0);
          des_const_xmlChar_ptr(n_type,val_00,1);
          des_int(content._4_4_,iVar2,2);
          des_xmlElementContentPtr(local_44,val_01,3);
          xmlResetLastError();
          iVar2 = xmlMemBlocks();
          if (iVar1 != iVar2) {
            iVar2 = xmlMemBlocks();
            printf("Leak of %d blocks found in xmlSAX2ElementDecl",(ulong)(uint)(iVar2 - iVar1));
            ctx._4_4_ = ctx._4_4_ + 1;
            printf(" %d",(ulong)name._4_4_);
            printf(" %d",(ulong)(uint)n_type);
            printf(" %d",(ulong)content._4_4_);
            printf(" %d");
            printf("\n");
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ctx._4_4_;
}

Assistant:

static int
test_xmlSAX2ElementDecl(void) {
    int test_ret = 0;

    int mem_base;
    void * ctx; /* the user data (XML parser context) */
    int n_ctx;
    xmlChar * name; /* the element name */
    int n_name;
    int type; /* the element type */
    int n_type;
    xmlElementContentPtr content; /* the element value tree */
    int n_content;

    for (n_ctx = 0;n_ctx < gen_nb_void_ptr;n_ctx++) {
    for (n_name = 0;n_name < gen_nb_const_xmlChar_ptr;n_name++) {
    for (n_type = 0;n_type < gen_nb_int;n_type++) {
    for (n_content = 0;n_content < gen_nb_xmlElementContentPtr;n_content++) {
        mem_base = xmlMemBlocks();
        ctx = gen_void_ptr(n_ctx, 0);
        name = gen_const_xmlChar_ptr(n_name, 1);
        type = gen_int(n_type, 2);
        content = gen_xmlElementContentPtr(n_content, 3);

        xmlSAX2ElementDecl(ctx, (const xmlChar *)name, type, content);
        call_tests++;
        des_void_ptr(n_ctx, ctx, 0);
        des_const_xmlChar_ptr(n_name, (const xmlChar *)name, 1);
        des_int(n_type, type, 2);
        des_xmlElementContentPtr(n_content, content, 3);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlSAX2ElementDecl",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctx);
            printf(" %d", n_name);
            printf(" %d", n_type);
            printf(" %d", n_content);
            printf("\n");
        }
    }
    }
    }
    }
    function_tests++;

    return(test_ret);
}